

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

CompilerMSL * __thiscall
spirv_cross::CompilerMSL::convert_to_f32(CompilerMSL *this,string *expr,uint32_t components)

{
  BaseType in_ECX;
  undefined4 in_register_00000014;
  undefined1 local_1a8 [40];
  SPIRType t;
  uint32_t components_local;
  string *expr_local;
  CompilerMSL *this_local;
  
  t.member_name_cache._M_h._M_single_bucket._4_4_ = in_ECX;
  SPIRType::SPIRType((SPIRType *)(local_1a8 + 0x20),OpTypeVector - (in_ECX < Boolean));
  t.super_IVariant.self.id = 0xd;
  t.basetype = t.member_name_cache._M_h._M_single_bucket._4_4_;
  t.width = 1;
  CompilerGLSL::type_to_glsl_constructor_abi_cxx11_((CompilerGLSL *)local_1a8,(SPIRType *)expr);
  join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            ((spirv_cross *)this,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
             (char (*) [2])0x422b6e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_register_00000014,components),(char (*) [2])0x40bd22);
  ::std::__cxx11::string::~string((string *)local_1a8);
  SPIRType::~SPIRType((SPIRType *)(local_1a8 + 0x20));
  return this;
}

Assistant:

string CompilerMSL::convert_to_f32(const string &expr, uint32_t components)
{
	SPIRType t { components > 1 ? OpTypeVector : OpTypeFloat };
	t.basetype = SPIRType::Float;
	t.vecsize = components;
	t.columns = 1;
	return join(type_to_glsl_constructor(t), "(", expr, ")");
}